

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O3

knetFile * khttp_parse_url(char *fn,char *mode)

{
  char cVar1;
  char cVar2;
  int iVar3;
  knetFile *pkVar4;
  char *pcVar5;
  char *__s1;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  
  iVar3 = strncmp(fn,"http://",7);
  if (iVar3 == 0) {
    lVar6 = 0;
    for (pcVar8 = fn + 7; (cVar1 = *pcVar8, cVar1 != '\0' && (cVar1 != '/')); pcVar8 = pcVar8 + 1) {
      lVar6 = lVar6 + 0x100000000;
    }
    pkVar4 = (knetFile *)calloc(1,0x80);
    pcVar5 = (char *)calloc(lVar6 + 0x100000000 >> 0x20,1);
    pkVar4->http_host = pcVar5;
    strncpy(pcVar5,fn + 7,lVar6 >> 0x20);
    pcVar5[lVar6 >> 0x20] = '\0';
    for (pcVar7 = pcVar5; *pcVar7 != '\0'; pcVar7 = pcVar7 + 1) {
      if (*pcVar7 == ':') {
        *pcVar7 = '\0';
        pcVar7 = pcVar7 + 1;
        break;
      }
    }
    __s1 = getenv("http_proxy");
    if (__s1 == (char *)0x0) {
      pcVar5 = strdup(pcVar5);
      cVar2 = *pcVar7;
      pkVar4->host = pcVar5;
      pcVar5 = "80";
      if (cVar2 != '\0') {
        pcVar5 = pcVar7;
      }
      pcVar7 = strdup(pcVar5);
      pkVar4->port = pcVar7;
      if (cVar1 == '\0') {
        pcVar8 = "/";
      }
    }
    else {
      iVar3 = strncmp(__s1,"http://",7);
      pcVar8 = __s1 + 7;
      if (iVar3 != 0) {
        pcVar8 = __s1;
      }
      pcVar8 = strdup(pcVar8);
      pkVar4->host = pcVar8;
      do {
        pcVar7 = pcVar8;
        pcVar8 = pcVar7 + 1;
        if (*pcVar7 == '\0') {
          pcVar7 = "80";
          goto LAB_00110ef0;
        }
      } while (*pcVar7 != ':');
      *pcVar7 = '\0';
      pcVar7 = "80";
      if (*pcVar8 != '\0') {
        pcVar7 = pcVar8;
      }
LAB_00110ef0:
      pcVar8 = strdup(pcVar7);
      pkVar4->port = pcVar8;
      pcVar8 = fn;
    }
    pcVar8 = strdup(pcVar8);
    pkVar4->path = pcVar8;
    pkVar4->type = 3;
    pkVar4->fd = -1;
    pkVar4->ctrl_fd = -1;
  }
  else {
    pkVar4 = (knetFile *)0x0;
  }
  return pkVar4;
}

Assistant:

knetFile *khttp_parse_url(const char *fn, const char *mode)
{
	knetFile *fp;
	char *p, *proxy, *q;
	int l;
	if (strstr(fn, "http://") != fn) return 0;
	// set ->http_host
	for (p = (char*)fn + 7; *p && *p != '/'; ++p);
	l = p - fn - 7;
	fp = (knetFile*)calloc(1, sizeof(knetFile));
	fp->http_host = (char*)calloc(l + 1, 1);
	strncpy(fp->http_host, fn + 7, l);
	fp->http_host[l] = 0;
	for (q = fp->http_host; *q && *q != ':'; ++q);
	if (*q == ':') *q++ = 0;
	// get http_proxy
	proxy = getenv("http_proxy");
	// set ->host, ->port and ->path
	if (proxy == 0) {
		fp->host = strdup(fp->http_host); // when there is no proxy, server name is identical to http_host name.
		fp->port = strdup(*q? q : "80");
		fp->path = strdup(*p? p : "/");
	} else {
		fp->host = (strstr(proxy, "http://") == proxy)? strdup(proxy + 7) : strdup(proxy);
		for (q = fp->host; *q && *q != ':'; ++q);
		if (*q == ':') *q++ = 0; 
		fp->port = strdup(*q? q : "80");
		fp->path = strdup(fn);
	}
	fp->type = KNF_TYPE_HTTP;
	fp->ctrl_fd = fp->fd = -1;
	fp->seek_offset = 0;
	return fp;
}